

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_request.hpp
# Opt level: O0

bool __thiscall cinatra::coro_http_request::is_upgrade(coro_http_request *this)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view key;
  bool bVar1;
  size_type sVar2;
  long in_RDI;
  string_view sVar3;
  string_view sec_ws_key;
  string_view u;
  char *in_stack_ffffffffffffff98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  coro_http_request *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  char *pcVar4;
  
  bVar1 = http_parser::has_upgrade(*(http_parser **)(in_RDI + 0x58));
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    sVar3._M_str = in_stack_ffffffffffffffe0;
    sVar3._M_len = in_stack_ffffffffffffffd8;
    sVar3 = get_header_value(in_stack_ffffffffffffffd0,sVar3);
    pcVar4 = (char *)sVar3._M_len;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe0)
    ;
    if ((!bVar1) &&
       (__x._M_str = pcVar4, __x._M_len = (size_t)"websocket", __y._M_str = (char *)0x9,
       __y._M_len = (size_t)in_stack_ffffffffffffffa8, bVar1 = std::operator==(__x,__y),
       ((bVar1 ^ 0xffU) & 1) == 0)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      key._M_str = pcVar4;
      key._M_len = in_stack_ffffffffffffffd8;
      get_header_value(in_stack_ffffffffffffffd0,key);
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xffffffffffffffa0);
      if ((!bVar1) &&
         (sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             &stack0xffffffffffffffa0), sVar2 == 0x18)) {
        *(undefined1 *)(in_RDI + 0x78) = 1;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool is_upgrade() {
    if (!parser_.has_upgrade())
      return false;

    auto u = get_header_value("Upgrade");
    if (u.empty())
      return false;

    if (u != WEBSOCKET)
      return false;

    auto sec_ws_key = get_header_value("sec-websocket-key");
    if (sec_ws_key.empty() || sec_ws_key.size() != 24)
      return false;

    is_websocket_ = true;
    return true;
  }